

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

curl_socket_t accept_connection(curl_socket_t sock)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  undefined4 local_1c;
  uint local_18;
  int flag;
  int error;
  curl_socket_t msgsock;
  curl_socket_t sock_local;
  
  flag = -1;
  local_1c = 1;
  error = sock;
  if (num_sockets == 0x400) {
    logmsg("Too many open sockets!");
    msgsock = -1;
  }
  else {
    flag = accept(sock,(sockaddr *)0x0,(socklen_t *)0x0);
    if (got_exit_signal == 0) {
      if (flag == -1) {
        puVar4 = (uint *)__errno_location();
        uVar1 = *puVar4;
        if ((uVar1 == 0xb) || (uVar1 == 0xb)) {
          msgsock = 0;
        }
        else {
          local_18 = uVar1;
          pcVar5 = strerror(uVar1);
          logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",(ulong)uVar1,pcVar5);
          msgsock = -1;
        }
      }
      else {
        iVar3 = curlx_nonblock(flag,1);
        if (iVar3 == 0) {
          iVar3 = setsockopt(flag,1,9,&local_1c,4);
          if (iVar3 == 0) {
            if (serverlogslocked == 0) {
              set_advisor_read_lock("log/serverlogs.lock");
            }
            serverlogslocked = serverlogslocked + 1;
            logmsg("====> Client connect");
            all_sockets[num_sockets] = flag;
            num_sockets = num_sockets + 1;
            _Var2 = socket_domain_is_ip();
            if ((_Var2) && (iVar3 = setsockopt(flag,6,1,&local_1c,4), iVar3 != 0)) {
              logmsg("====> TCP_NODELAY failed");
            }
            msgsock = flag;
          }
          else {
            puVar4 = (uint *)__errno_location();
            uVar1 = *puVar4;
            local_18 = uVar1;
            pcVar5 = strerror(uVar1);
            logmsg("setsockopt(SO_KEEPALIVE) failed with error: (%d) %s",(ulong)uVar1,pcVar5);
            close(flag);
            msgsock = -1;
          }
        }
        else {
          puVar4 = (uint *)__errno_location();
          uVar1 = *puVar4;
          local_18 = uVar1;
          pcVar5 = strerror(uVar1);
          logmsg("curlx_nonblock failed with error: (%d) %s",(ulong)uVar1,pcVar5);
          close(flag);
          msgsock = -1;
        }
      }
    }
    else {
      if (flag != -1) {
        close(flag);
      }
      msgsock = -1;
    }
  }
  return msgsock;
}

Assistant:

static curl_socket_t accept_connection(curl_socket_t sock)
{
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int error;
  int flag = 1;

  if(MAX_SOCKETS == num_sockets) {
    logmsg("Too many open sockets!");
    return CURL_SOCKET_BAD;
  }

  msgsock = accept(sock, NULL, NULL);

  if(got_exit_signal) {
    if(CURL_SOCKET_BAD != msgsock)
      sclose(msgsock);
    return CURL_SOCKET_BAD;
  }

  if(CURL_SOCKET_BAD == msgsock) {
    error = SOCKERRNO;
    if(EAGAIN == error || EWOULDBLOCK == error) {
      /* nothing to accept */
      return 0;
    }
    logmsg("MAJOR ERROR: accept() failed with error: (%d) %s",
           error, strerror(error));
    return CURL_SOCKET_BAD;
  }

  if(0 != curlx_nonblock(msgsock, TRUE)) {
    error = SOCKERRNO;
    logmsg("curlx_nonblock failed with error: (%d) %s",
           error, strerror(error));
    sclose(msgsock);
    return CURL_SOCKET_BAD;
  }

  if(0 != setsockopt(msgsock, SOL_SOCKET, SO_KEEPALIVE,
                     (void *)&flag, sizeof(flag))) {
    error = SOCKERRNO;
    logmsg("setsockopt(SO_KEEPALIVE) failed with error: (%d) %s",
           error, strerror(error));
    sclose(msgsock);
    return CURL_SOCKET_BAD;
  }

  /*
  ** As soon as this server accepts a connection from the test harness it
  ** must set the server logs advisor read lock to indicate that server
  ** logs should not be read until this lock is removed by this server.
  */

  if(!serverlogslocked)
    set_advisor_read_lock(SERVERLOGS_LOCK);
  serverlogslocked += 1;

  logmsg("====> Client connect");

  all_sockets[num_sockets] = msgsock;
  num_sockets += 1;

#ifdef TCP_NODELAY
  if(socket_domain_is_ip()) {
    /*
     * Disable the Nagle algorithm to make it easier to send out a large
     * response in many small segments to torture the clients more.
     */
    if(0 != setsockopt(msgsock, IPPROTO_TCP, TCP_NODELAY,
                       (void *)&flag, sizeof(flag)))
      logmsg("====> TCP_NODELAY failed");
  }
#endif

  return msgsock;
}